

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O0

bool __thiscall nivalis::Shell::eval_line(Shell *this,string *line)

{
  string_view expr_00;
  string_view expr_01;
  string_view expr_02;
  string_view expr_03;
  bool bVar1;
  uint uVar2;
  long lVar3;
  char *pcVar4;
  ostream *poVar5;
  ulong uVar6;
  string *psVar7;
  ulong uVar8;
  size_type sVar9;
  reference pvVar10;
  uint64_t __n;
  Expr *this_00;
  void *pvVar11;
  string *in_RSI;
  byte *in_RDI;
  undefined1 auVar12 [16];
  uint64_t addr_1;
  double var_val;
  size_t i_3;
  uint64_t addr;
  size_t i_2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> bindings;
  double output;
  Expr diff;
  Expr expr;
  string parse_err;
  size_t i_1;
  size_t i;
  size_t prev_comma;
  size_type brpos;
  size_t pos;
  string diff_var;
  uint64_t diff_var_addr;
  bool do_diff;
  bool will_use_latex;
  bool do_optim;
  string cmd;
  bool def_fn;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  def_fn_args;
  string var;
  string str_to_parse;
  int assn_opcode;
  string *in_stack_00001378;
  value_type *in_stack_fffffffffffffae8;
  string *os;
  undefined4 in_stack_fffffffffffffaf0;
  uint32_t in_stack_fffffffffffffaf4;
  Expr *in_stack_fffffffffffffaf8;
  string *in_stack_fffffffffffffb00;
  Environment *in_stack_fffffffffffffb08;
  Environment *in_stack_fffffffffffffb10;
  undefined4 in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb1c;
  Environment *in_stack_fffffffffffffb28;
  string *in_stack_fffffffffffffb30;
  string *in_stack_fffffffffffffb48;
  string *in_stack_fffffffffffffb50;
  Environment *in_stack_fffffffffffffb58;
  string *in_stack_fffffffffffffb60;
  string *psVar13;
  Environment *in_stack_fffffffffffffb68;
  size_t max_args;
  undefined1 in_stack_fffffffffffffbbe;
  byte mode_explicit;
  Environment *in_stack_fffffffffffffbc0;
  string *in_stack_fffffffffffffbe0;
  bool local_386;
  bool local_382;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffc80;
  Environment *in_stack_fffffffffffffc88;
  string *in_stack_fffffffffffffc90;
  Environment *in_stack_fffffffffffffc98;
  Environment *local_2c0;
  ulong local_2b8;
  ulong local_2a0;
  Environment *local_280;
  string local_260 [56];
  string local_228 [32];
  string *local_208;
  string local_200 [32];
  undefined1 local_1e0 [16];
  string local_1d0 [32];
  string local_1b0 [32];
  undefined1 local_190 [16];
  string local_180 [32];
  ulong local_160;
  long local_158;
  ulong local_150;
  string local_148 [32];
  undefined1 local_128 [16];
  size_t local_118;
  undefined1 local_110 [16];
  string local_100 [32];
  uint64_t local_e0;
  byte local_d3;
  bool local_d2;
  bool local_d1;
  string local_d0 [32];
  string local_b0 [32];
  uint local_90;
  byte local_79;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  string local_60;
  string local_40 [36];
  uint32_t local_1c;
  byte local_1;
  
  local_1c = 0x18;
  std::__cxx11::string::string(local_40);
  std::__cxx11::string::string((string *)&local_60);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x138da1);
  util::trim((string *)0x138dae);
  std::__cxx11::string::operator=(local_40,in_RSI);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                          (char *)in_stack_fffffffffffffae8);
  if (bVar1) {
    in_RDI[1] = 1;
    local_1 = 1;
    local_90 = 1;
    goto LAB_0013a46a;
  }
  std::__cxx11::string::string(local_b0);
  lVar3 = std::__cxx11::string::size();
  if ((lVar3 != 0) &&
     (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI), *pcVar4 == '%')) {
    anon_unknown.dwarf_330c7::get_word(in_stack_fffffffffffffb48);
    std::__cxx11::string::operator=(local_b0,local_d0);
    std::__cxx11::string::~string(local_d0);
  }
  util::trim((string *)0x138eda);
  util::trim((string *)0x138ee9);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                          (char *)in_stack_fffffffffffffae8);
  if (bVar1) {
    bVar1 = Environment::del(in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
    if (!bVar1) {
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),"Undefined variable ");
      poVar5 = std::operator<<(poVar5,in_RSI);
      std::operator<<(poVar5,"\n");
      local_1 = 0;
      local_90 = 1;
      goto LAB_0013a44c;
    }
    poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),"del ");
    poVar5 = std::operator<<(poVar5,in_RSI);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
LAB_0013a439:
    local_1 = 1;
    local_90 = 1;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                            (char *)in_stack_fffffffffffffae8);
    if (bVar1) {
      bVar1 = Environment::del_func(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
      if (bVar1) {
        poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),"delf ");
        poVar5 = std::operator<<(poVar5,in_RSI);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        goto LAB_0013a439;
      }
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),"Undefined function ");
      poVar5 = std::operator<<(poVar5,in_RSI);
      std::operator<<(poVar5,"\n");
      local_1 = 0;
      local_90 = 1;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                              (char *)in_stack_fffffffffffffae8);
      local_382 = true;
      if (!bVar1) {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                                (char *)in_stack_fffffffffffffae8);
        local_382 = true;
        if (!bVar1) {
          local_382 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT44(in_stack_fffffffffffffaf4,
                                                  in_stack_fffffffffffffaf0),
                                      (char *)in_stack_fffffffffffffae8);
        }
      }
      local_d1 = local_382;
      if ((*in_RDI & 1) == 0) {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                                (char *)in_stack_fffffffffffffae8);
        local_386 = false;
        if (bVar1) goto LAB_00139224;
      }
      else {
LAB_00139224:
        local_386 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0)
                                    ,(char *)in_stack_fffffffffffffae8);
      }
      local_d2 = local_386;
      local_d3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                                 (char *)in_stack_fffffffffffffae8);
      if ((local_d1 & 1U) != 0) {
        std::__cxx11::string::operator=(local_40,in_RSI);
      }
      if ((local_d3 & 1) != 0) {
        anon_unknown.dwarf_330c7::get_word(in_stack_fffffffffffffb48);
        util::trim((string *)0x1392e3);
        util::trim((string *)0x1392f2);
        local_110 = std::__cxx11::string::operator_cast_to_basic_string_view(local_100);
        expr_00._M_len._4_4_ = in_stack_fffffffffffffaf4;
        expr_00._M_len._0_4_ = in_stack_fffffffffffffaf0;
        expr_00._M_str = (char *)in_stack_fffffffffffffaf8;
        bVar1 = util::is_varname(expr_00);
        if (bVar1) {
          local_e0 = Environment::addr_of
                               (in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,
                                SUB81((ulong)in_stack_fffffffffffffb58 >> 0x38,0));
          std::__cxx11::string::operator=(local_40,in_RSI);
        }
        else {
          poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),local_100);
          std::operator<<(poVar5," is not a valid variable name\n");
          local_1 = 0;
        }
        local_90 = (uint)!bVar1;
        std::__cxx11::string::~string(local_100);
        if (local_90 != 0) goto LAB_0013a44c;
      }
      local_79 = 0;
      local_1c = 0x18;
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
      bVar1 = util::is_varname_first(*pcVar4);
      if (bVar1) {
        local_128 = std::__cxx11::string::operator_cast_to_basic_string_view(local_40);
        expr_03._M_str._0_4_ = in_stack_fffffffffffffb18;
        expr_03._M_len = (size_t)in_stack_fffffffffffffb10;
        expr_03._M_str._4_4_ = in_stack_fffffffffffffb1c;
        local_118 = util::find_equality(expr_03,SUB81((ulong)in_stack_fffffffffffffb08 >> 0x38,0),
                                        SUB81((ulong)in_stack_fffffffffffffb08 >> 0x30,0));
        if (local_118 != 0xffffffffffffffff) {
          std::__cxx11::string::substr((ulong)local_148,(ulong)local_40);
          std::__cxx11::string::operator=((string *)&local_60,local_148);
          std::__cxx11::string::~string(local_148);
          util::trim((string *)0x139549);
          pcVar4 = (char *)std::__cxx11::string::back();
          bVar1 = util::is_arith_operator(*pcVar4);
          if (bVar1) {
            pcVar4 = (char *)std::__cxx11::string::back();
            local_1c = OpCode::from_char(*pcVar4);
            std::__cxx11::string::pop_back();
            util::trim((string *)0x1395c4);
          }
          pcVar4 = (char *)std::__cxx11::string::back();
          if (*pcVar4 == ')') {
            local_150 = std::__cxx11::string::find((char)&local_60,0x28);
            if (local_150 != 0xffffffffffffffff) {
              local_79 = 1;
              local_158 = local_150 + 1;
              local_160 = local_150;
LAB_0013963e:
              local_160 = local_160 + 1;
              uVar8 = local_160;
              uVar6 = std::__cxx11::string::size();
              if (uVar8 < uVar6) {
                pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&local_60);
                if (*pcVar4 != ',') goto code_r0x0013969e;
                goto LAB_001396d1;
              }
LAB_00139907:
              std::__cxx11::string::substr((ulong)local_1b0,(ulong)&local_60);
              in_stack_fffffffffffffbe0 = &local_60;
              std::__cxx11::string::operator=((string *)in_stack_fffffffffffffbe0,local_1b0);
              std::__cxx11::string::~string(local_1b0);
              util::rtrim(in_stack_fffffffffffffb30);
              if ((local_79 & 1) != 0) {
                std::__cxx11::string::substr((ulong)local_1d0,(ulong)local_40);
                std::__cxx11::string::operator=(local_40,local_1d0);
                std::__cxx11::string::~string(local_1d0);
              }
            }
          }
          else {
            local_1e0 = std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((string *)&local_60);
            expr_02._M_len._4_4_ = in_stack_fffffffffffffaf4;
            expr_02._M_len._0_4_ = in_stack_fffffffffffffaf0;
            expr_02._M_str = (char *)in_stack_fffffffffffffaf8;
            bVar1 = util::is_varname(expr_02);
            if (bVar1) {
              std::__cxx11::string::substr((ulong)local_200,(ulong)local_40);
              std::__cxx11::string::operator=(local_40,local_200);
              std::__cxx11::string::~string(local_200);
            }
          }
        }
      }
      local_208 = (string *)0x0;
      while( true ) {
        psVar13 = local_208;
        psVar7 = (string *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size(&local_78);
        if (psVar7 <= psVar13) break;
        in_stack_fffffffffffffbc0 = *(Environment **)(in_RDI + 0x10);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_78,(size_type)local_208);
        Environment::addr_of
                  (in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,
                   SUB81((ulong)in_stack_fffffffffffffb58 >> 0x38,0));
        local_208 = (string *)&local_208->field_0x1;
      }
      std::__cxx11::string::string(local_228);
      if ((local_d2 & 1U) == 0) {
        std::__cxx11::string::string(local_260,local_40);
      }
      else {
        latex_to_nivalis(in_stack_00001378);
      }
      max_args = *(size_t *)(in_RDI + 0x10);
      mode_explicit = 1;
      if ((local_d3 & 1) == 0) {
        mode_explicit = local_d1;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::size(&local_78);
      os = local_228;
      parse(psVar13,in_stack_fffffffffffffbc0,(bool)mode_explicit,(bool)in_stack_fffffffffffffbbe,
            max_args,in_stack_fffffffffffffbe0);
      std::__cxx11::string::~string(local_260);
      lVar3 = std::__cxx11::string::size();
      if (lVar3 == 0) {
        if ((local_d1 & 1U) == 0) {
          if ((local_d3 & 1) == 0) {
            if ((local_79 & 1) == 0) {
              local_280 = (Environment *)
                          Expr::operator()((Expr *)in_stack_fffffffffffffb30,
                                           in_stack_fffffffffffffb28);
              uVar2 = std::isnan((double)local_280);
              if ((uVar2 & 1) != 0) goto LAB_0013a3e7;
            }
            lVar3 = std::__cxx11::string::size();
            if (lVar3 != 0) {
              uVar8 = std::__cxx11::string::empty();
              if ((uVar8 & 1) != 0) {
                if ((local_79 & 1) == 0) {
                  if (local_1c == 0x18) {
                    local_2c0 = local_280;
                  }
                  else {
                    this_00 = (Expr *)Environment::addr_of
                                                (in_stack_fffffffffffffb68,in_stack_fffffffffffffb60
                                                 ,SUB81((ulong)in_stack_fffffffffffffb58 >> 0x38,0))
                    ;
                    if (this_00 == (Expr *)0xffffffffffffffff) {
                      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),"Undefined variable \"");
                      poVar5 = std::operator<<(poVar5,(string *)&local_60);
                      std::operator<<(poVar5,"\" (operator assignment)\n");
                      local_1 = 0;
                      local_90 = 1;
                      goto LAB_0013a3f2;
                    }
                    std::vector<double,_std::allocator<double>_>::operator[]
                              (*(vector<double,_std::allocator<double>_> **)(in_RDI + 0x10),
                               (size_type)this_00);
                    Expr::constant((double)in_stack_fffffffffffffb08);
                    Expr::constant((double)in_stack_fffffffffffffb08);
                    Expr::combine(in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf4,(Expr *)os);
                    local_2c0 = (Environment *)Expr::operator()(this_00,in_stack_fffffffffffffb28);
                    in_stack_fffffffffffffb10 = local_2c0;
                    Expr::~Expr((Expr *)0x13a284);
                    Expr::~Expr((Expr *)0x13a291);
                    Expr::~Expr((Expr *)0x13a29e);
                  }
                  Environment::set(in_stack_fffffffffffffb10,(string *)in_stack_fffffffffffffb08,
                                   (double)in_stack_fffffffffffffb00);
                  poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)&local_60);
                  in_stack_fffffffffffffb00 = (string *)std::operator<<(poVar5," = ");
                  pvVar11 = (void *)std::ostream::operator<<
                                              (in_stack_fffffffffffffb00,(double)local_2c0);
                  std::ostream::operator<<(pvVar11,std::endl<char,std::char_traits<char>>);
                }
                else {
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x139e33);
                  local_2a0 = 0;
                  while( true ) {
                    sVar9 = std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::size(&local_78);
                    if (sVar9 <= local_2a0) break;
                    pvVar10 = std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::operator[](&local_78,local_2a0);
                    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)pvVar10);
                    if (*pcVar4 != '$') {
                      psVar13 = *(string **)(in_RDI + 0x10);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[](&local_78,local_2a0);
                      in_stack_fffffffffffffb68 =
                           (Environment *)
                           Environment::addr_of
                                     (in_stack_fffffffffffffb68,psVar13,
                                      SUB81((ulong)in_stack_fffffffffffffb58 >> 0x38,0));
                    }
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                               (value_type_conflict1 *)os);
                    local_2a0 = local_2a0 + 1;
                  }
                  __n = Environment::def_func
                                  (in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,
                                   (Expr *)in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
                  if (__n != 0xffffffffffffffff) {
                    poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)&local_60);
                    std::operator<<(poVar5,"(");
                    local_2b8 = 0;
                    while( true ) {
                      uVar8 = local_2b8;
                      sVar9 = std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::size(&local_78);
                      if (sVar9 <= uVar8) break;
                      if (local_2b8 != 0) {
                        std::operator<<(*(ostream **)(in_RDI + 8),", ");
                      }
                      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),"$");
                      std::ostream::operator<<(poVar5,local_2b8);
                      local_2b8 = local_2b8 + 1;
                    }
                    std::operator<<(*(ostream **)(in_RDI + 8),") = ");
                    std::
                    vector<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
                    ::operator[]((vector<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
                                  *)(*(long *)(in_RDI + 0x10) + 0x30),__n);
                    poVar5 = Expr::repr((Expr *)CONCAT44(in_stack_fffffffffffffaf4,
                                                         in_stack_fffffffffffffaf0),(ostream *)os,
                                        (Environment *)0x13a0f9);
                    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
                  }
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             in_stack_fffffffffffffb00);
                }
                goto LAB_0013a3e7;
              }
            }
            pvVar11 = (void *)std::ostream::operator<<(*(void **)(in_RDI + 8),(double)local_280);
            std::ostream::operator<<(pvVar11,std::endl<char,std::char_traits<char>>);
          }
          else {
            Expr::diff((Expr *)in_stack_fffffffffffffc98,(uint64_t)in_stack_fffffffffffffc90,
                       in_stack_fffffffffffffc88);
            poVar5 = Expr::repr((Expr *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0
                                                ),(ostream *)os,(Environment *)0x139d34);
            std::operator<<(poVar5,"\n");
            Expr::~Expr((Expr *)0x139d61);
          }
        }
        else {
          Expr::optimize((Expr *)in_stack_fffffffffffffb60,
                         (int)((ulong)in_stack_fffffffffffffb58 >> 0x20));
          poVar5 = Expr::repr((Expr *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                              (ostream *)os,(Environment *)0x139cb9);
          std::operator<<(poVar5,"\n");
        }
LAB_0013a3e7:
        local_90 = 0;
      }
      else {
        std::operator<<(*(ostream **)(in_RDI + 8),local_228);
        local_1 = 0;
        local_90 = 1;
      }
LAB_0013a3f2:
      Expr::~Expr((Expr *)0x13a3ff);
      std::__cxx11::string::~string(local_228);
      if (local_90 == 0) goto LAB_0013a439;
    }
  }
LAB_0013a44c:
  std::__cxx11::string::~string(local_b0);
LAB_0013a46a:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffb00);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string(local_40);
  return (bool)(local_1 & 1);
code_r0x0013969e:
  pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&local_60);
  if (*pcVar4 != ')') goto LAB_0013963e;
LAB_001396d1:
  std::__cxx11::string::substr((ulong)local_180,(ulong)&local_60);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
              in_stack_fffffffffffffae8);
  std::__cxx11::string::~string(local_180);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
  util::trim((string *)0x139734);
  pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&local_60);
  if (*pcVar4 == ')') {
    sVar9 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&local_78);
    if (sVar9 == 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
      uVar8 = std::__cxx11::string::empty();
      if ((uVar8 & 1) != 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x1397a0);
        goto LAB_00139907;
      }
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
  uVar8 = std::__cxx11::string::empty();
  if ((uVar8 & 1) == 0) {
    pvVar10 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)pvVar10);
    if (*pcVar4 != '$') {
      pvVar10 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
      auVar12 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar10);
      expr_01._M_len._4_4_ = in_stack_fffffffffffffaf4;
      expr_01._M_len._0_4_ = in_stack_fffffffffffffaf0;
      expr_01._M_str = (char *)in_stack_fffffffffffffaf8;
      local_190 = auVar12;
      bVar1 = util::is_varname(expr_01);
      if (!bVar1) goto LAB_0013986f;
    }
    local_158 = local_160 + 1;
    goto LAB_0013963e;
  }
LAB_0013986f:
  poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),"\'");
  pvVar10 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
  poVar5 = std::operator<<(poVar5,(string *)pvVar10);
  std::operator<<(poVar5,"\': invalid argument variable name\n");
  local_79 = 0;
  goto LAB_00139907;
}

Assistant:

bool Shell::eval_line(std::string line) {
    int assn_opcode = OpCode::bsel;
    std::string str_to_parse, var;
    std::vector<std::string> def_fn_args;
    bool def_fn;
    util::trim(line);
    str_to_parse = line;
    if (line == "exit") {
        // Exit shell, if applicable
        closed = true;
        return true;
    }

    std::string cmd;
    if (line.size() && line[0] == '%') {
        cmd = get_word(line);
    }
    util::trim(line);
    util::trim(cmd);
    if (cmd == "%del") {
        // Delete variable
        if (env.del(line)) {
            os << "del " << line << std::endl;
        } else {
            os << "Undefined variable " << line << "\n";
            return false;
        }
    } else if (cmd == "%delf") {
        // Delete function
        if (env.del_func(line)) {
            os << "delf " << line << std::endl;
        } else {
            os << "Undefined function " << line << "\n";
            return false;
        }
    } else {
        bool do_optim = cmd == "%" || cmd == "%tex" || cmd == "%niv";
        bool will_use_latex = (use_latex || cmd == "%tex") && cmd != "%niv";
        bool do_diff = cmd == "%diff";
        if (do_optim) str_to_parse = line;
        uint64_t diff_var_addr;
        if (do_diff) {
            std::string diff_var = get_word(line);
            util::trim(diff_var); util::trim(line);
            if (!util::is_varname(diff_var)) {
                os << diff_var << " is not a valid variable name\n";
                return false;
            }
            diff_var_addr = env.addr_of(diff_var, false);
            str_to_parse = line;
        }
        // Evaluate
        def_fn = false;
        assn_opcode = OpCode::bsel;
        if (util::is_varname_first(str_to_parse[0])) {
            size_t pos = util::find_equality(str_to_parse);
            if (~pos) {
                var = str_to_parse.substr(0, pos);
                util::trim(var);
                if (util::is_arith_operator(var.back())) {
                    assn_opcode = OpCode::from_char(var.back());
                    var.pop_back();
                    util::trim(var);
                }
                if (var.back() == ')') {
                    auto brpos = var.find('(');
                    if (brpos != std::string::npos) {
                        // Function def
                        def_fn = true;
                        size_t prev_comma = brpos + 1;
                        for (size_t i = brpos + 1; i < var.size(); ++i) {
                            if (var[i] == ',' || var[i] == ')') {
                                def_fn_args.push_back(var.substr(
                                            prev_comma, i - prev_comma));
                                util::trim(def_fn_args.back());
                                if (var[i] == ')' && def_fn_args.size() == 1 &&
                                    def_fn_args.back().empty()) {
                                    // Function with no arguments
                                    def_fn_args.clear();
                                    break;
                                }
                                if (def_fn_args.back().empty() ||
                                    (def_fn_args.back()[0] != '$' &&
                                    !util::is_varname(def_fn_args.back()))) {
                                    os << "'" << def_fn_args.back() <<
                                        "': invalid argument variable name\n";
                                    def_fn = false;
                                    break;
                                }
                                prev_comma = i + 1;
                            }
                        }
                        var = var.substr(0, brpos);
                        util::rtrim(var);
                        if (def_fn) str_to_parse = str_to_parse.substr(pos + 1);
                    }
                } else if (util::is_varname(var)) {
                    // Assignment
                    str_to_parse = str_to_parse.substr(pos + 1);
                }
            }
        }

        for (size_t i = 0; i < def_fn_args.size(); ++i) {
            // Pre-register variables
            env.addr_of(def_fn_args[i], false);
        }
        std::string parse_err;
        Expr expr = parse(will_use_latex ?  latex_to_nivalis(str_to_parse)
                : str_to_parse, env, !(do_diff || do_optim), // expicit
                true, // quiet
                def_fn_args.size(), // max args
                &parse_err);
        if (parse_err.size()) {
            os << parse_err;
            return false;
        }
        if (do_optim) {
            expr.optimize();
            expr.repr(os, env) << "\n";
        } else if (do_diff) {
            Expr diff = expr.diff(diff_var_addr, env);
            diff.repr(os, env) << "\n";
        } else {
            double output;
            if (def_fn || !std::isnan(output = expr(env))) {
                // Assignment statement
                if (var.size() && parse_err.empty()) {
                    if (def_fn) {
                        // Define function
                        std::vector<uint64_t> bindings;
                        for (size_t i = 0; i < def_fn_args.size(); ++i) {
                            bindings.push_back(
                                    def_fn_args[i][0] == '$' ? -1 :
                                    env.addr_of(def_fn_args[i]));
                        }
                        auto addr = env.def_func(var, expr, bindings);
                        if (~addr) {
                            os << var << "(";
                            for (size_t i = 0; i < def_fn_args.size(); ++i) {
                                if (i) os << ", ";
                                os << "$" << i;
                            }
                            os << ") = ";
                            env.funcs[addr].expr.repr(os, env) << std::endl;
                        }

                    } else {
                        // Define variable
                        double var_val;
                        if (assn_opcode != OpCode::bsel) {
                            // Operator assignment
                            auto addr = env.addr_of(var, true);
                            if (addr == -1) {
                                os << "Undefined variable \"" << var
                                    << "\" (operator assignment)\n";
                                return false;
                            }
                            var_val = Expr::constant(env.vars[addr])
                                .combine(assn_opcode,
                                        Expr::constant(output))(env);
                        } else {
                            // Usual assignment
                            var_val = output;
                        }
                        env.set(var, var_val);
                        os << var << " = " << var_val << std::endl;
                    }
                } else {
                    os << output << std::endl;
                }
            }
        }
    }
    return true;
}